

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O3

value hello_world_object_impl_interface_get(object obj,object_impl impl,accessor_type *accessor)

{
  char *pcVar1;
  value pvVar2;
  
  pcVar1 = (char *)attribute_name((accessor->data).key);
  if (*pcVar1 == 'e') {
    if (pcVar1[1] == '\0') {
      pvVar2 = (value)value_create_long(*(undefined8 *)((long)impl + 8));
      return pvVar2;
    }
  }
  else if ((*pcVar1 == 'd') && (pcVar1[1] == '\0')) {
    pvVar2 = (value)value_create_char((int)*impl);
    return pvVar2;
  }
  return (value)0x0;
}

Assistant:

value hello_world_object_impl_interface_get(object obj, object_impl impl, struct accessor_type *accessor)
{
	hello_world_object hello_world = (hello_world_object)impl;
	attribute attr = accessor->data.attr;
	const char *key = attribute_name(attr);

	(void)obj;

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "d") == 0)
	{
		return value_create_char(hello_world->d);
	}
	else if (strcmp(key, "e") == 0)
	{
		return value_create_long(hello_world->e);
	}

	return NULL;
}